

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O3

void __thiscall Diligent::BasicFile::BasicFile(BasicFile *this,FileOpenAttribs *OpenAttribs)

{
  EFileAccessMode EVar1;
  size_type sVar2;
  size_t sVar3;
  pointer pcVar4;
  size_type sVar5;
  char *__s;
  String *Path;
  
  this->_vptr_BasicFile = (_func_int **)&PTR__BasicFile_00b5d7c8;
  __s = "";
  if (OpenAttribs->strFilePath != (Char *)0x0) {
    __s = OpenAttribs->strFilePath;
  }
  (this->m_Path)._M_dataplus._M_p = (pointer)&(this->m_Path).field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_Path,__s,__s + sVar3);
  pcVar4 = (this->m_Path)._M_dataplus._M_p;
  sVar2 = (this->m_Path)._M_string_length;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      if (pcVar4[sVar5] == '\\') {
        pcVar4[sVar5] = '/';
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
    pcVar4 = (this->m_Path)._M_dataplus._M_p;
  }
  EVar1 = OpenAttribs->AccessMode;
  (this->m_OpenAttribs).strFilePath = pcVar4;
  (this->m_OpenAttribs).AccessMode = EVar1;
  return;
}

Assistant:

BasicFile::BasicFile(const FileOpenAttribs& OpenAttribs) :
    m_Path //
    {
        [](const Char* strPath) //
        {
            String Path = strPath != nullptr ? strPath : "";
            BasicFileSystem::CorrectSlashes(Path);
            return Path;
        }(OpenAttribs.strFilePath) //
    },
    m_OpenAttribs{m_Path.c_str(), OpenAttribs.AccessMode}
{
}